

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O1

bool __thiscall QTableWidgetItem::isSelected(QTableWidgetItem *this)

{
  undefined1 uVar1;
  QItemSelectionModel *pQVar2;
  char *__s;
  QModelIndex *pQVar3;
  long in_FS_OFFSET;
  undefined1 *local_38;
  undefined1 *puStack_30;
  QTableWidgetItem *local_28;
  QTableWidgetItem **local_18;
  
  local_18 = *(QTableWidgetItem ***)(in_FS_OFFSET + 0x28);
  if ((QAbstractItemView *)this->view != (QAbstractItemView *)0x0) {
    pQVar2 = QAbstractItemView::selectionModel((QAbstractItemView *)this->view);
    if (pQVar2 != (QItemSelectionModel *)0x0) {
      QAbstractItemView::model((QAbstractItemView *)this->view);
      __s = (char *)QMetaObject::cast((QObject *)&QTableModel::staticMetaObject);
      if (__s != (char *)0x0) {
        local_28 = (QTableWidgetItem *)&DAT_aaaaaaaaaaaaaaaa;
        local_38 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
        QTableModel::index((QTableModel *)&local_38,__s,(int)this);
        pQVar3 = (QModelIndex *)QAbstractItemView::selectionModel((QAbstractItemView *)this->view);
        uVar1 = QItemSelectionModel::isSelected(pQVar3);
        goto LAB_0059fc6e;
      }
    }
  }
  uVar1 = 0;
LAB_0059fc6e:
  if (*(QTableWidgetItem ***)(in_FS_OFFSET + 0x28) == local_18) {
    return (bool)uVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QTableWidgetItem::isSelected() const
{
    if (!view || !view->selectionModel())
        return false;
    const QTableModel *model = qobject_cast<const QTableModel*>(view->model());
    if (!model)
        return false;
    const QModelIndex index = model->index(this);
    return view->selectionModel()->isSelected(index);
}